

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_opengl.c
# Opt level: O0

void MOJOSHADER_glSetLegacyBumpMapEnv
               (uint sampler,float mat00,float mat01,float mat10,float mat11,float lscale,
               float loffset)

{
  GLfloat *pGVar1;
  GLfloat *dstf;
  float loffset_local;
  float lscale_local;
  float mat11_local;
  float mat10_local;
  float mat01_local;
  float mat00_local;
  uint sampler_local;
  
  if ((sampler != 0) && (sampler < 5)) {
    pGVar1 = ctx->texbem_state + (sampler - 1) * 6;
    *pGVar1 = mat00;
    pGVar1[1] = mat01;
    pGVar1[2] = mat10;
    pGVar1[3] = mat11;
    pGVar1[4] = lscale;
    pGVar1[5] = loffset;
    ctx->generation = ctx->generation + 1;
  }
  return;
}

Assistant:

void MOJOSHADER_glSetLegacyBumpMapEnv(unsigned int sampler, float mat00,
                                      float mat01, float mat10, float mat11,
                                      float lscale, float loffset)
{
    if ((sampler == 0) || (sampler > (MAX_TEXBEMS+1)))
        return;

    GLfloat *dstf = ctx->texbem_state + (6 * (sampler-1));
    *(dstf++) = (GLfloat) mat00;
    *(dstf++) = (GLfloat) mat01;
    *(dstf++) = (GLfloat) mat10;
    *(dstf++) = (GLfloat) mat11;
    *(dstf++) = (GLfloat) lscale;
    *(dstf++) = (GLfloat) loffset;
    ctx->generation++;
}